

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological-sort.cpp
# Opt level: O0

void __thiscall TopologicalSortTest_Chain_Test::TestBody(TopologicalSortTest_Chain_Test *this)

{
  allocator<unsigned_int> *this_00;
  allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_01;
  initializer_list<unsigned_int> __l;
  initializer_list<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __l_00;
  bool bVar1;
  reference this_02;
  char *message;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_2b8;
  AssertHelper local_290;
  Message local_288;
  undefined1 local_280 [8];
  AssertionResult gtest_ar;
  uint local_268 [10];
  iterator local_240;
  size_type local_238;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_230;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_228;
  undefined1 local_210 [24];
  set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  expected;
  TopologicalOrdersImpl<std::monostate> local_160;
  undefined1 local_f0 [8];
  set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  results;
  TopologicalOrders orders;
  uint local_48;
  Index i;
  allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_31;
  undefined1 local_30 [8];
  Graph_conflict graph;
  Index n;
  TopologicalSortTest_Chain_Test *this_local;
  
  graph.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 10;
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator(&local_31);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_30,10,&local_31);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator(&local_31);
  for (local_48 = 1; local_48 < 10; local_48 = local_48 + 1) {
    this_02 = std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            *)local_30,(ulong)local_48);
    orders.selectors.
    super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_48 - 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (this_02,(value_type_conflict2 *)
                       ((long)&orders.selectors.
                               super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  }
  ::wasm::TopologicalOrdersImpl<std::monostate>::TopologicalOrdersImpl
            ((TopologicalOrdersImpl<std::monostate> *)
             &results._M_t._M_impl.super__Rb_tree_header._M_node_count,(Graph_conflict *)local_30);
  ::wasm::TopologicalOrdersImpl<std::monostate>::begin
            (&local_160,
             (TopologicalOrdersImpl<std::monostate> *)
             &results._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ::wasm::TopologicalOrdersImpl<std::monostate>::end
            ((TopologicalOrdersImpl<std::monostate> *)
             &expected._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (TopologicalOrdersImpl<std::monostate> *)
             &results._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::less<std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::set<wasm::TopologicalOrdersImpl<std::monostate>>
            ((set<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::less<std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)local_f0,&local_160,
             (TopologicalOrdersImpl<std::monostate> *)
             &expected._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ::wasm::TopologicalOrdersImpl<std::monostate>::~TopologicalOrdersImpl
            ((TopologicalOrdersImpl<std::monostate> *)
             &expected._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ::wasm::TopologicalOrdersImpl<std::monostate>::~TopologicalOrdersImpl(&local_160);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._6_1_ = 1;
  local_268[4] = 5;
  local_268[5] = 4;
  local_268[6] = 3;
  local_268[7] = 2;
  local_268[0] = 9;
  local_268[1] = 8;
  local_268[2] = 7;
  local_268[3] = 6;
  local_268[8] = 1;
  local_268[9] = 0;
  local_240 = local_268;
  local_238 = 10;
  this_00 = (allocator<unsigned_int> *)
            ((long)&gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 7);
  local_230 = &local_228;
  std::allocator<unsigned_int>::allocator(this_00);
  __l._M_len = local_238;
  __l._M_array = local_240;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_228,__l,this_00);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._6_1_ = 0;
  local_210._0_8_ = &local_228;
  local_210._8_8_ = (pointer)0x1;
  this_01 = (allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
            ((long)&gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 4);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator(this_01);
  __l_00._M_len = local_210._8_8_;
  __l_00._M_array = (iterator)local_210._0_8_;
  std::
  set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::set((set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         *)(local_210 + 0x10),__l_00,
        (less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
        ((long)&gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        + 5),this_01);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 4));
  local_2b8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_210;
  do {
    local_2b8 = local_2b8 + -1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(local_2b8);
  } while (local_2b8 != &local_228);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  testing::internal::EqHelper::
  Compare<std::set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_nullptr>
            ((EqHelper *)local_280,"results","expected",
             (set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)local_f0,
             (set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)(local_210 + 0x10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_280);
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/topological-sort.cpp"
               ,0x44,message);
    testing::internal::AssertHelper::operator=(&local_290,&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  std::
  set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~set((set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *)(local_210 + 0x10));
  std::
  set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~set((set<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *)local_f0);
  ::wasm::TopologicalOrdersImpl<std::monostate>::~TopologicalOrdersImpl
            ((TopologicalOrdersImpl<std::monostate> *)
             &results._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_30);
  return;
}

Assistant:

TEST(TopologicalSortTest, Chain) {
  constexpr Index n = 10;
  Graph graph(n);
  for (Index i = 1; i < n; ++i) {
    graph[i].push_back(i - 1);
  }
  TopologicalOrders orders(graph);
  std::set<std::vector<Index>> results(orders.begin(), orders.end());
  std::set<std::vector<Index>> expected{{9, 8, 7, 6, 5, 4, 3, 2, 1, 0}};
  EXPECT_EQ(results, expected);
}